

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O2

bool __thiscall PatternBlock::isInstructionMatch(PatternBlock *this,ParserWalker *walker)

{
  uintm uVar1;
  ulong uVar2;
  pointer puVar3;
  int byteoff;
  ulong uVar4;
  bool bVar5;
  
  bVar5 = this->nonzerosize == 0;
  if (0 < this->nonzerosize) {
    byteoff = this->offset;
    puVar3 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    for (uVar4 = 0;
        uVar2 = (long)(this->maskvec).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar3 >> 2, bVar5 = uVar2 <= uVar4,
        uVar4 < uVar2; uVar4 = uVar4 + 1) {
      uVar1 = ParserWalker::getInstructionBytes(walker,byteoff,4);
      puVar3 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((uVar1 & puVar3[uVar4]) !=
          (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4]) {
        return bVar5;
      }
      byteoff = byteoff + 4;
    }
  }
  return bVar5;
}

Assistant:

bool PatternBlock::isInstructionMatch(ParserWalker &walker) const

{
  if (nonzerosize<=0) return (nonzerosize==0);
  int4 off = offset;
  for(int4 i=0;i<maskvec.size();++i) {
    uintm data = walker.getInstructionBytes(off,sizeof(uintm));
    if ((maskvec[i] & data)!=valvec[i]) return false;
    off += sizeof(uintm);
  }
  return true;
}